

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_check_ip_acl(char *acl,uint32_t remote_ip)

{
  int iVar1;
  bool bVar2;
  undefined1 local_40 [8];
  mg_str vec;
  uint local_28;
  uint32_t mask;
  uint32_t net;
  int flag;
  int allowed;
  uint32_t remote_ip_local;
  char *acl_local;
  
  bVar2 = true;
  if (acl != (char *)0x0) {
    bVar2 = *acl == '\0';
  }
  net = 0x2d;
  flag = remote_ip;
  _allowed = acl;
  if (bVar2) {
    net = 0x2b;
  }
  while( true ) {
    _allowed = mg_next_comma_list_entry(_allowed,(mg_str *)local_40,(mg_str *)0x0);
    if (_allowed == (char *)0x0) {
      return (uint)(net == 0x2b);
    }
    mask = (uint32_t)*(char *)local_40;
    if (((mask != 0x2b) && (mask != 0x2d)) ||
       (iVar1 = parse_net((char *)((long)local_40 + 1),&local_28,(uint32_t *)((long)&vec.len + 4)),
       iVar1 == 0)) break;
    if (local_28 == (flag & vec.len._4_4_)) {
      net = mask;
    }
  }
  return -1;
}

Assistant:

int mg_check_ip_acl(const char *acl, uint32_t remote_ip) {
    int allowed, flag;
    uint32_t net, mask;
    struct mg_str vec;

    /* If any ACL is set, deny by default */
    allowed = (acl == NULL || *acl == '\0') ? '+' : '-';

    while ((acl = mg_next_comma_list_entry(acl, &vec, NULL)) != NULL) {
        flag = vec.p[0];
        if ((flag != '+' && flag != '-') ||
            parse_net(&vec.p[1], &net, &mask) == 0) {
            return -1;
        }

        if (net == (remote_ip & mask)) {
            allowed = flag;
        }
    }

    return allowed == '+';
}